

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void __thiscall zmq::array_t<zmq::pipe_t,_2>::push_back(array_t<zmq::pipe_t,_2> *this,pipe_t *item_)

{
  size_type sVar1;
  value_type *in_RSI;
  vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  array_item_t<2> *in_stack_ffffffffffffffe0;
  array_item_t<2> *this_00;
  
  if (in_RSI != (value_type *)0x0) {
    this_00 = (array_item_t<2> *)0x0;
    if (in_RSI != (value_type *)0x0) {
      this_00 = (array_item_t<2> *)(in_RSI + 5);
    }
    in_stack_ffffffffffffffe0 = this_00;
    sVar1 = std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::size(in_RDI);
    array_item_t<2>::set_array_index(this_00,(int)sVar1);
    in_stack_ffffffffffffffd8 = in_RSI;
  }
  std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::push_back
            ((vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *)in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void push_back (T *item_)
    {
        if (item_)
            static_cast<item_t *> (item_)->set_array_index (
              static_cast<int> (_items.size ()));
        _items.push_back (item_);
    }